

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O3

string * slang::ast::formatWidth<slang::ast::StreamingConcatenationExpression>
                   (string *__return_storage_ptr__,StreamingConcatenationExpression *bitstream,
                   BitstreamSizeMode mode)

{
  unsigned_long uVar1;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *psVar2;
  basic_string_view<char> fmt;
  basic_string_view<char> fmt_00;
  basic_string_view<char> fmt_01;
  pair<unsigned_long,_unsigned_long> pVar3;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_00;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_01;
  FormatBuffer buffer;
  unsigned_long local_258 [2];
  unsigned_long local_248;
  buffer<char> local_230;
  char local_210 [504];
  undefined1 local_18;
  
  local_230.size_ = 0;
  local_230._vptr_buffer = (_func_int **)&PTR_grow_005076d8;
  local_230.capacity_ = 500;
  local_18 = 0;
  local_230.ptr_ = local_210;
  pVar3 = dynamicBitstreamSize(bitstream,mode);
  local_258[0] = pVar3.second;
  uVar1 = pVar3.first;
  if (uVar1 == 0) {
    fmt_00.size_ = 2;
    fmt_00.data_ = "{}";
    args_00.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_258;
    args_00.desc_ = 4;
    ::fmt::v9::detail::vformat_to<char>(&local_230,fmt_00,args_00,(locale_ref)0x0);
  }
  else if (local_258[0] == 0) {
    fmt_01.size_ = 4;
    fmt_01.data_ = "{}*n";
    args_01.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_258;
    args_01.desc_ = 4;
    local_258[0] = uVar1;
    ::fmt::v9::detail::vformat_to<char>(&local_230,fmt_01,args_01,(locale_ref)0x0);
  }
  else {
    fmt.size_ = 7;
    fmt.data_ = "{}*n+{}";
    args.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_258;
    args.desc_ = 0x44;
    local_248 = local_258[0];
    local_258[0] = uVar1;
    ::fmt::v9::detail::vformat_to<char>(&local_230,fmt,args,(locale_ref)0x0);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_230.ptr_,local_230.ptr_ + local_230.size_);
  psVar2 = extraout_RAX;
  if (local_230.ptr_ != local_210) {
    operator_delete(local_230.ptr_,local_230.capacity_);
    psVar2 = extraout_RAX_00;
  }
  return psVar2;
}

Assistant:

static std::string formatWidth(const T& bitstream, BitstreamSizeMode mode) {
    FormatBuffer buffer;
    auto [multiplier, fixedSize] = dynamicBitstreamSize(bitstream, mode);
    if (!multiplier)
        buffer.format("{}", fixedSize);
    else if (!fixedSize)
        buffer.format("{}*n", multiplier);
    else
        buffer.format("{}*n+{}", multiplier, fixedSize);
    return buffer.str();
}